

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O0

int CfdFreeDescriptorHandle(void *handle,void *descriptor_handle)

{
  void *pvVar1;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  CfdCapiOutputDescriptor *descriptor_struct;
  vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *in_stack_ffffffffffffff70
  ;
  allocator local_51;
  string local_50 [4];
  uint32_t in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  
  cfd::Initialize();
  if (in_RSI != 0) {
    if (*(long *)(in_RSI + 0x10) != 0) {
      pvVar1 = *(void **)(in_RSI + 0x10);
      if (pvVar1 != (void *)0x0) {
        std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::~vector
                  ((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                   in_stack_ffffffffffffff70);
        operator_delete(pvVar1);
      }
      *(undefined8 *)(in_RSI + 0x10) = 0;
    }
    if (*(long *)(in_RSI + 0x18) != 0) {
      pvVar1 = *(void **)(in_RSI + 0x18);
      if (pvVar1 != (void *)0x0) {
        std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::~vector
                  ((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                   in_stack_ffffffffffffff70);
        operator_delete(pvVar1);
      }
      *(undefined8 *)(in_RSI + 0x18) = 0;
    }
    if (*(long *)(in_RSI + 0x20) != 0) {
      pvVar1 = *(void **)(in_RSI + 0x20);
      if (pvVar1 != (void *)0x0) {
        std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::~vector
                  (in_stack_ffffffffffffff70);
        operator_delete(pvVar1);
      }
      *(undefined8 *)(in_RSI + 0x20) = 0;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"Descriptor",&local_51);
  cfd::capi::FreeBuffer
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return 0;
}

Assistant:

int CfdFreeDescriptorHandle(void* handle, void* descriptor_handle) {
  try {
    cfd::Initialize();
    if (descriptor_handle != nullptr) {
      CfdCapiOutputDescriptor* descriptor_struct =
          static_cast<CfdCapiOutputDescriptor*>(descriptor_handle);
      if (descriptor_struct->script_root != nullptr) {
        delete descriptor_struct->script_root;
        descriptor_struct->script_root = nullptr;
      }
      if (descriptor_struct->script_list != nullptr) {
        delete descriptor_struct->script_list;
        descriptor_struct->script_list = nullptr;
      }
      if (descriptor_struct->multisig_key_list != nullptr) {
        delete descriptor_struct->multisig_key_list;
        descriptor_struct->multisig_key_list = nullptr;
      }
    }
    FreeBuffer(
        descriptor_handle, kPrefixOutputDescriptor,
        sizeof(CfdCapiOutputDescriptor));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}